

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOOLElimination.cpp
# Opt level: O3

Formula * __thiscall FOOLElimination::process(FOOLElimination *this,Formula *formula)

{
  Formula *pFVar1;
  TermList booleanTerm;
  void **head;
  Formula *dummy;
  LambdaElimination le;
  LambdaElimination local_1d8 [3];
  string local_78;
  string local_58;
  
  if ((*(int *)(Lib::env + 0xf538) != 0) && (this->_polymorphic == false)) {
    local_1d8[0]._combinators._cursor = (Combinator *)0x0;
    local_1d8[0]._combinators._end = (Combinator *)0x0;
    local_1d8[0]._combinators._capacity = 0;
    local_1d8[0]._combinators._stack = (Combinator *)0x0;
    local_1d8[0]._processedSorts._cursor = (TermList *)0x0;
    local_1d8[0]._processedSorts._end = (TermList *)0x0;
    local_1d8[0]._processedSorts._capacity = 0;
    local_1d8[0]._processedSorts._stack = (TermList *)0x0;
    local_1d8[0]._processed._cursor = (TermList *)0x0;
    local_1d8[0]._processed._end = (TermList *)0x0;
    local_1d8[0]._processed._capacity = 0;
    local_1d8[0]._processed._stack = (TermList *)0x0;
    booleanTerm = LambdaElimination::elimLambda(local_1d8,formula);
    pFVar1 = toEquality(booleanTerm);
    if ((*(char *)(Lib::env + 0x913a) != '\0') || ((*(byte *)(Lib::env + 0xa1d2) & 1) != 0)) {
      Kernel::Formula::toString_abi_cxx11_(&local_58,formula);
      Kernel::Formula::toString_abi_cxx11_(&local_78,pFVar1);
      reportProcessed(&local_58,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
    }
    LambdaElimination::~LambdaElimination(local_1d8);
    return pFVar1;
  }
  pFVar1 = (Formula *)
           (*(code *)(&DAT_009077c0 + *(int *)(&DAT_009077c0 + (ulong)formula->_connective * 4)))();
  return pFVar1;
}

Assistant:

Formula* FOOLElimination::process(Formula* formula) {
  if(env.options->cnfOnTheFly() != Options::CNFOnTheFly::EAGER &&
     !_polymorphic){
    LambdaElimination le = LambdaElimination();
    TermList proxifiedFormula = le.elimLambda(formula);
    Formula* processedFormula = toEquality(proxifiedFormula);

    if (env.options->showPreprocessing()) {
      reportProcessed(formula->toString(), processedFormula->toString());
    }

    return processedFormula;
  }

  switch (formula->connective()) {
    case LITERAL: {
      Literal* literal = formula->literal();

      /**
       * Processing of a literal simply propagates processing to its arguments,
       * except for a case when it is an equality and one of the arguments is a
       * formula-as-term. In that case we build an equivalence between both
       * arguments, processed as formulas.
       *
       * For example, assume a and b are formulas and X is a boolean variable.
       * Then, a = b will be translated to a' <=> b', where a' and b' are
       * processed a and b, respectively. a = X will be translated as
       * a' <=> (X = true).
       *
       * The semantics of FOOL does not distinguish between equality and equivalence
       * between boolean terms and this special case implements a more natural way of
       * expressing an equality between formulas in FOL. It is not, however, strictly
       * needed - without it the equality would be processed simply as equality
       * between FOOL boolean terms.
       */

      if (literal->isEquality() &&
         (!env.getMainProblem()->isHigherOrder() || env.options->equalityToEquivalence())) {
        ASS_EQ(literal->arity(), 2);
        TermList lhs = *literal->nthArgument(0);
        TermList rhs = *literal->nthArgument(1);

        bool lhsIsFormula = lhs.isTerm() && lhs.term()->isBoolean();
        bool rhsIsFormula = rhs.isTerm() && rhs.term()->isBoolean();

        if (rhsIsFormula || lhsIsFormula) {
          Formula* lhsFormula = processAsFormula(lhs);
          Formula* rhsFormula = processAsFormula(rhs);

          Connective connective = literal->polarity() ? IFF : XOR;
          Formula* processedFormula = new BinaryFormula(connective, lhsFormula, rhsFormula);

          if (env.options->showPreprocessing()) {
            reportProcessed(formula->toString(), processedFormula->toString());
          }

          return processedFormula;
        }
      }

      Stack<TermList> arguments;
      Term::Iterator lit(literal);
      while (lit.hasNext()) {
        arguments.push(process(lit.next()));
      }

      Formula* processedFormula = new AtomicFormula(Literal::create(literal, arguments.begin()));

      if (env.options->showPreprocessing()) {
        reportProcessed(formula->toString(), processedFormula->toString());
      }

      return processedFormula;
    }

    case IFF:
    case XOR: {
      /**
       * Processing of a binary formula simply propagates processing to its
       * arguments, except for a case when it is an equivalence between two
       * boolean terms. In that case we build an equality between processed
       * underlying boolean terms.
       *
       * The semantics of FOOL does not distinguish between equality and
       * equivalence between boolean terms and this special case implements
       * a more natural way of expressing an equality between formulas in FOL.
       * It is not, however, strictly needed - without it the equality would be
       * processed simply as equality between FOOL boolean terms.
       */
      Formula* lhs = formula->left();
      Formula* rhs = formula->right();
      if (lhs->connective() == BOOL_TERM && rhs->connective() == BOOL_TERM) {
        TermList lhsTerm = lhs->getBooleanTerm();
        TermList rhsTerm = rhs->getBooleanTerm();

        bool polarity = formula->connective() == IFF;

        Literal* equality = Literal::createEquality(polarity, process(lhsTerm), process(rhsTerm), AtomicSort::boolSort());
        Formula* processedFormula = new AtomicFormula(equality);

        if (env.options->showPreprocessing()) {
          reportProcessed(formula->toString(), processedFormula->toString());
        }

        return processedFormula;
      }
      // deliberately no break here so that we would jump to the IMP case
    }

    case IMP:
      return new BinaryFormula(formula->connective(), process(formula->left()), process(formula->right()));

    case AND:
    case OR:
      return new JunctionFormula(formula->connective(), process(formula->args()));

    case NOT:
      return new NegatedFormula(process(formula->uarg()));

    case FORALL:
    case EXISTS:
      return new QuantifiedFormula(formula->connective(), formula->vars(),formula->sorts(), process(formula->qarg()));

    case BOOL_TERM: {
      Formula* processedFormula = processAsFormula(formula->getBooleanTerm());

      if (env.options->showPreprocessing()) {
        reportProcessed(formula->toString(), processedFormula->toString());
      }

      return processedFormula;
    }

    case TRUE:
    case FALSE:
      return formula;

    case NAME:
    case NOCONN:
      ASSERTION_VIOLATION;
  }
  ASSERTION_VIOLATION;
}